

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreBinarySerializer.cpp
# Opt level: O2

void __thiscall
Assimp::Ogre::OgreBinarySerializer::ReadAnimationKeyFrames
          (OgreBinarySerializer *this,Animation *anim,VertexAnimationTrack *track)

{
  PoseRefList *this_00;
  bool bVar1;
  uint16_t uVar2;
  VertexData *pVVar3;
  uint8_t *puVar4;
  MemoryIOStream *__p;
  ulong uVar5;
  size_t numBytes;
  PoseRef pr;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  PoseKeyFrame kf;
  long lVar6;
  
  if (*(int *)&this->m_reader->end != *(int *)&this->m_reader->current) {
    uVar2 = ReadHeader(this,true);
    this_00 = &kf.references;
    while (*(int *)&this->m_reader->end != *(int *)&this->m_reader->current) {
      if (1 < (ushort)(uVar2 + 0x2eef)) {
        RollbackHeader(this);
        return;
      }
      if (uVar2 == 0xd111) {
        kf.references.
        super__Vector_base<Assimp::Ogre::PoseRef,_std::allocator<Assimp::Ogre::PoseRef>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        kf.references.
        super__Vector_base<Assimp::Ogre::PoseRef,_std::allocator<Assimp::Ogre::PoseRef>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        kf.timePos = Read<float>(this);
        bVar1 = Read<bool>(this);
        pVVar3 = Animation::AssociatedVertexData(anim,track);
        lVar6 = 0xc;
        if (bVar1) {
          lVar6 = 0x18;
        }
        numBytes = lVar6 * (ulong)(pVVar3->super_IVertexData).count;
        puVar4 = ReadBytes(this,numBytes);
        __p = (MemoryIOStream *)Intern::AllocateFromAssimpHeap::operator_new(0x28);
        (__p->super_IOStream)._vptr_IOStream = (_func_int **)&PTR__MemoryIOStream_0080bab0;
        __p->buffer = puVar4;
        __p->length = numBytes;
        __p->pos = 0;
        __p->own = true;
        std::__shared_ptr<Assimp::MemoryIOStream,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<Assimp::MemoryIOStream,void>
                  ((__shared_ptr<Assimp::MemoryIOStream,(__gnu_cxx::_Lock_policy)2> *)&pr,__p);
        std::__shared_ptr<Assimp::MemoryIOStream,_(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_ptr<Assimp::MemoryIOStream,_(__gnu_cxx::_Lock_policy)2> *)this_00,
                   (__shared_ptr<Assimp::MemoryIOStream,_(__gnu_cxx::_Lock_policy)2> *)&pr);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58);
        std::vector<Assimp::Ogre::MorphKeyFrame,_std::allocator<Assimp::Ogre::MorphKeyFrame>_>::
        push_back(&track->morphKeyFrames,(value_type *)&kf);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &kf.references.
                    super__Vector_base<Assimp::Ogre::PoseRef,_std::allocator<Assimp::Ogre::PoseRef>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
        uVar2 = 0xd111;
      }
      else {
        kf.references.
        super__Vector_base<Assimp::Ogre::PoseRef,_std::allocator<Assimp::Ogre::PoseRef>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        kf.references.
        super__Vector_base<Assimp::Ogre::PoseRef,_std::allocator<Assimp::Ogre::PoseRef>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        kf.references.
        super__Vector_base<Assimp::Ogre::PoseRef,_std::allocator<Assimp::Ogre::PoseRef>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        kf.timePos = Read<float>(this);
        if (*(int *)&this->m_reader->end == *(int *)&this->m_reader->current) {
          uVar2 = 0xd112;
        }
        else {
          uVar2 = ReadHeader(this,true);
          while( true ) {
            uVar5 = (long)this->m_reader->end - (long)this->m_reader->current;
            if ((uVar2 != 0xd113) || ((uVar5 & 0xffffffff) == 0)) break;
            pr.index = Read<unsigned_short>(this);
            pr.influence = Read<float>(this);
            std::vector<Assimp::Ogre::PoseRef,_std::allocator<Assimp::Ogre::PoseRef>_>::push_back
                      (this_00,(value_type *)&pr);
            if (*(int *)&this->m_reader->end == *(int *)&this->m_reader->current) {
              uVar2 = 0xd113;
            }
            else {
              uVar2 = ReadHeader(this,true);
            }
          }
          if ((int)uVar5 != 0) {
            RollbackHeader(this);
          }
        }
        std::vector<Assimp::Ogre::PoseKeyFrame,_std::allocator<Assimp::Ogre::PoseKeyFrame>_>::
        push_back(&track->poseKeyFrames,&kf);
        std::_Vector_base<Assimp::Ogre::PoseRef,_std::allocator<Assimp::Ogre::PoseRef>_>::
        ~_Vector_base(&this_00->
                       super__Vector_base<Assimp::Ogre::PoseRef,_std::allocator<Assimp::Ogre::PoseRef>_>
                     );
      }
      if (*(int *)&this->m_reader->end != *(int *)&this->m_reader->current) {
        uVar2 = ReadHeader(this,true);
      }
    }
  }
  return;
}

Assistant:

void OgreBinarySerializer::ReadAnimationKeyFrames(Animation *anim, VertexAnimationTrack *track)
{
    if (!AtEnd())
    {
        uint16_t id = ReadHeader();
        while (!AtEnd() &&
            (id == M_ANIMATION_MORPH_KEYFRAME ||
             id == M_ANIMATION_POSE_KEYFRAME))
        {
            if (id == M_ANIMATION_MORPH_KEYFRAME)
            {
                MorphKeyFrame kf;
                kf.timePos = Read<float>();
                bool hasNormals = Read<bool>();

                size_t vertexCount = anim->AssociatedVertexData(track)->count;
                size_t vertexSize = sizeof(float) * (hasNormals ? 6 : 3);
                size_t numBytes = vertexCount * vertexSize;

                uint8_t *morphBuffer = ReadBytes(numBytes);
                kf.buffer = MemoryStreamPtr(new Assimp::MemoryIOStream(morphBuffer, numBytes, true));

                track->morphKeyFrames.push_back(kf);
            }
            else if (id == M_ANIMATION_POSE_KEYFRAME)
            {
                PoseKeyFrame kf;
                kf.timePos = Read<float>();

                if (!AtEnd())
                {
                    id = ReadHeader();
                    while (!AtEnd() && id == M_ANIMATION_POSE_REF)
                    {
                        PoseRef pr;
                        pr.index = Read<uint16_t>();
                        pr.influence = Read<float>();
                        kf.references.push_back(pr);

                        if (!AtEnd())
                            id = ReadHeader();
                    }
                    if (!AtEnd())
                        RollbackHeader();
                }

                track->poseKeyFrames.push_back(kf);
            }

            if (!AtEnd())
                id = ReadHeader();
        }
        if (!AtEnd())
            RollbackHeader();
    }
}